

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5StorageStmt(Fts5Storage *p,int eStmt,sqlite3_stmt **pp,char **pzErrMsg)

{
  int iVar1;
  int in_ESI;
  long in_RDI;
  int rc;
  
  iVar1 = fts5StorageGetStmt(p,eStmt,pp,pzErrMsg);
  if (iVar1 == 0) {
    *(undefined8 *)(in_RDI + 0x30 + (long)in_ESI * 8) = 0;
  }
  return iVar1;
}

Assistant:

static int sqlite3Fts5StorageStmt(
  Fts5Storage *p,
  int eStmt,
  sqlite3_stmt **pp,
  char **pzErrMsg
){
  int rc;
  assert( eStmt==FTS5_STMT_SCAN_ASC
       || eStmt==FTS5_STMT_SCAN_DESC
       || eStmt==FTS5_STMT_LOOKUP
  );
  rc = fts5StorageGetStmt(p, eStmt, pp, pzErrMsg);
  if( rc==SQLITE_OK ){
    assert( p->aStmt[eStmt]==*pp );
    p->aStmt[eStmt] = 0;
  }
  return rc;
}